

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-utils.h
# Opt level: O0

void wasm::MemoryUtils::ensureExists(Module *wasm)

{
  bool bVar1;
  pointer pMVar2;
  Address *pAVar3;
  Name name;
  Type local_40;
  bool local_38 [8];
  Address local_30;
  Name local_28;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_18;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  Module *wasm_local;
  
  memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)wasm;
  bVar1 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty(&wasm->memories);
  if (bVar1) {
    wasm::Name::Name(&local_28,"0");
    wasm::Address::Address(&local_30,0);
    wasm::Address::Address((Address *)local_38,0x10000);
    wasm::Type::Type(&local_40,i32);
    name.super_IString.str._M_str = (char *)local_28.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)&local_18;
    Builder::makeMemory(name,(Address)local_28.super_IString.str._M_str,local_30,local_38[0],
                        (Type)0x0);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_18);
    pAVar3 = wasm::Address::operator=(&pMVar2->max,1);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_18);
    (pMVar2->initial).addr = pAVar3->addr;
    Module::addMemory((Module *)
                      memory._M_t.
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,&local_18);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_18);
  }
  return;
}

Assistant:

inline void ensureExists(Module* wasm) {
  if (wasm->memories.empty()) {
    auto memory = Builder::makeMemory("0");
    memory->initial = memory->max = 1;
    wasm->addMemory(std::move(memory));
  }
}